

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-splitting.cpp
# Opt level: O1

Results * wasm::ModuleSplitting::splitFunctions
                    (Results *__return_storage_ptr__,Module *primary,Config *config)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  map<unsigned_long,_wasm::Name,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_wasm::Name>_>_>
  *pmVar3;
  ModuleSplitter local_1b0;
  
  anon_unknown_0::ModuleSplitter::ModuleSplitter(&local_1b0,primary,config);
  (__return_storage_ptr__->secondary)._M_t.
  super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>._M_t.
  super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
  super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl =
       (Module *)
       local_1b0.secondaryPtr._M_t.
       super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>._M_t.
       super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
       super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl;
  local_1b0.secondaryPtr._M_t.
  super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>._M_t.
  super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
  super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl =
       (__uniq_ptr_data<wasm::Module,_std::default_delete<wasm::Module>,_true,_true>)
       (__uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>)0x0;
  p_Var1 = &(__return_storage_ptr__->placeholderMap)._M_t._M_impl.super__Rb_tree_header;
  if (local_1b0.placeholderMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent ==
      (_Base_ptr)0x0) {
    (__return_storage_ptr__->placeholderMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
         _S_red;
    (__return_storage_ptr__->placeholderMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
         = (_Base_ptr)0x0;
    (__return_storage_ptr__->placeholderMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &p_Var1->_M_header;
    (__return_storage_ptr__->placeholderMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         &p_Var1->_M_header;
    pmVar3 = (map<unsigned_long,_wasm::Name,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_wasm::Name>_>_>
              *)&(__return_storage_ptr__->placeholderMap)._M_t._M_impl;
  }
  else {
    p_Var2 = &local_1b0.placeholderMap._M_t._M_impl.super__Rb_tree_header;
    primary = (Module *)
              (ulong)local_1b0.placeholderMap._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
    (__return_storage_ptr__->placeholderMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
         local_1b0.placeholderMap._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
    (__return_storage_ptr__->placeholderMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
         = local_1b0.placeholderMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    (__return_storage_ptr__->placeholderMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         local_1b0.placeholderMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    (__return_storage_ptr__->placeholderMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_1b0.placeholderMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
    (local_1b0.placeholderMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
         &p_Var1->_M_header;
    pmVar3 = &local_1b0.placeholderMap;
    (__return_storage_ptr__->placeholderMap)._M_t._M_impl.super__Rb_tree_header._M_node_count =
         local_1b0.placeholderMap._M_t._M_impl.super__Rb_tree_header._M_node_count;
    local_1b0.placeholderMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
    ;
    local_1b0.placeholderMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &p_Var2->_M_header;
    local_1b0.placeholderMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         &p_Var2->_M_header;
  }
  *(size_t *)((long)&(pmVar3->_M_t)._M_impl.super__Rb_tree_header + 0x20) = 0;
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_wasm::Name>,_std::_Select1st<std::pair<const_unsigned_long,_wasm::Name>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_wasm::Name>_>_>
  ::~_Rb_tree(&local_1b0.placeholderMap._M_t);
  std::
  _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::Name>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
  ::~_Rb_tree(&local_1b0.exportedPrimaryFuncs._M_t);
  if (local_1b0.tableManager.activeTableSegments.
      super__Vector_base<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    primary = (Module *)
              ((long)local_1b0.tableManager.activeTableSegments.
                     super__Vector_base<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage -
              (long)local_1b0.tableManager.activeTableSegments.
                    super__Vector_base<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_>
                    ._M_impl.super__Vector_impl_data._M_start);
    operator_delete(local_1b0.tableManager.activeTableSegments.
                    super__Vector_base<wasm::ElementSegment_*,_std::allocator<wasm::ElementSegment_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,(ulong)primary);
  }
  std::
  _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::ModuleSplitting::(anonymous_namespace)::TableSlotManager::Slot>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::ModuleSplitting::(anonymous_namespace)::TableSlotManager::Slot>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::ModuleSplitting::(anonymous_namespace)::TableSlotManager::Slot>_>_>
  ::_M_erase((_Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::ModuleSplitting::(anonymous_namespace)::TableSlotManager::Slot>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::ModuleSplitting::(anonymous_namespace)::TableSlotManager::Slot>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::ModuleSplitting::(anonymous_namespace)::TableSlotManager::Slot>_>_>
              *)local_1b0.tableManager.funcIndices._M_t._M_impl.super__Rb_tree_header._M_header.
                _M_parent,(_Link_type)primary);
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree(&local_1b0.classifiedFuncs.second._M_t);
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
               *)&local_1b0.classifiedFuncs);
  std::unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_>::~unique_ptr
            (&local_1b0.secondaryPtr);
  return __return_storage_ptr__;
}

Assistant:

Results splitFunctions(Module& primary, const Config& config) {
  ModuleSplitter split(primary, config);
  return {std::move(split.secondaryPtr), std::move(split.placeholderMap)};
}